

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_number(string *number,unsigned_long_long H)

{
  ostream *this;
  string local_50 [32];
  ulong local_30;
  unsigned_long_long i;
  unsigned_long_long W;
  unsigned_long_long nl;
  unsigned_long_long H_local;
  string *number_local;
  
  nl = H;
  H_local = (unsigned_long_long)number;
  W = std::__cxx11::string::length();
  if (W % nl == 0) {
    i = W / nl;
    for (local_30 = 0; local_30 < nl; local_30 = local_30 + 1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)number);
      this = std::operator<<((ostream *)&std::cout,local_50);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_50);
    }
    return;
  }
  __assert_fail("0 == nl % H",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                ,0x15,"void print_number(std::string, unsigned long long)");
}

Assistant:

void print_number(std::string number, unsigned long long int H)
{
    unsigned long long int nl = number.length();
    assert(0 == nl % H);
    unsigned long long int W = nl/H;
    for (unsigned long long int i = 0; i < H; i++)
    {
        std::cout << number.substr(i*W, W) << std::endl;
    }
}